

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_vorbis.h
# Opt level: O0

int stb_vorbis_seek_frame(stb_vorbis *f,uint sample_number)

{
  code *pcVar1;
  int iVar2;
  int iVar3;
  uint in_ESI;
  vorb *in_RDI;
  int frame_samples;
  int mode;
  int right_end;
  int right_start;
  int left_end;
  int left_start;
  SDL_AssertState sdl_assert_state_1;
  SDL_AssertState sdl_assert_state;
  uint32 max_frame_samples;
  uint32 in_stack_00000044;
  stb_vorbis *in_stack_00000048;
  undefined4 in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd4;
  undefined4 in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  int in_stack_ffffffffffffffe0;
  int in_stack_ffffffffffffffe4;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  iVar2 = seek_to_sample_coarse(in_stack_00000048,in_stack_00000044);
  if (iVar2 == 0) {
    iVar2 = 0;
  }
  else {
    do {
      if (in_RDI->current_loc_valid != 0) goto LAB_001371e6;
      in_stack_ffffffffffffffe4 =
           SDL_ReportAssertion(&stb_vorbis_seek_frame::sdl_assert_data,"stb_vorbis_seek_frame",
                               "/workspace/llm4binary/github/license_all_cmakelists_25/0x0ade[P]FAudio/src/stb_vorbis.h"
                               ,0x130f);
    } while (in_stack_ffffffffffffffe4 == 0);
    if (in_stack_ffffffffffffffe4 == 1) {
      pcVar1 = (code *)swi(3);
      iVar2 = (*pcVar1)();
      return iVar2;
    }
LAB_001371e6:
    do {
      if (in_RDI->current_loc <= in_ESI) goto LAB_00137238;
      in_stack_ffffffffffffffe0 =
           SDL_ReportAssertion(&stb_vorbis_seek_frame::sdl_assert_data_1,"stb_vorbis_seek_frame",
                               "/workspace/llm4binary/github/license_all_cmakelists_25/0x0ade[P]FAudio/src/stb_vorbis.h"
                               ,0x1310);
    } while (in_stack_ffffffffffffffe0 == 0);
    if (in_stack_ffffffffffffffe0 == 1) {
      pcVar1 = (code *)swi(3);
      iVar2 = (*pcVar1)();
      return iVar2;
    }
LAB_00137238:
    iVar2 = in_RDI->blocksize_1 * 3 - in_RDI->blocksize_0 >> 2;
    while (in_RDI->current_loc < in_ESI) {
      iVar3 = peek_decode_initial((vorb *)CONCAT44(in_stack_fffffffffffffffc,
                                                   in_stack_fffffffffffffff8),(int *)in_RDI,
                                  (int *)CONCAT44(in_ESI,iVar2),
                                  (int *)CONCAT44(in_stack_ffffffffffffffe4,
                                                  in_stack_ffffffffffffffe0),
                                  (int *)CONCAT44(in_stack_ffffffffffffffdc,
                                                  in_stack_ffffffffffffffd8),
                                  (int *)CONCAT44(in_stack_ffffffffffffffd4,
                                                  in_stack_ffffffffffffffd0));
      if (iVar3 == 0) {
        iVar2 = error(in_RDI,VORBIS_seek_failed);
        return iVar2;
      }
      iVar3 = in_stack_ffffffffffffffd4 - in_stack_ffffffffffffffdc;
      if (in_ESI < in_RDI->current_loc + iVar3) {
        return 1;
      }
      if (in_ESI < in_RDI->current_loc + iVar3 + iVar2) {
        vorbis_pump_first_frame
                  ((stb_vorbis *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
      }
      else {
        in_RDI->current_loc = iVar3 + in_RDI->current_loc;
        in_RDI->previous_length = 0;
        maybe_start_packet((vorb *)CONCAT44(in_stack_ffffffffffffffcc,iVar3));
        flush_packet((vorb *)0x137334);
      }
    }
    if (in_RDI->current_loc == in_ESI) {
      iVar2 = 1;
    }
    else {
      iVar2 = error(in_RDI,VORBIS_seek_failed);
    }
  }
  return iVar2;
}

Assistant:

int stb_vorbis_seek_frame(stb_vorbis *f, unsigned int sample_number)
{
   uint32 max_frame_samples;

   if (IS_PUSH_MODE(f)) return error(f, VORBIS_invalid_api_mixing);

   // fast page-level search
   if (!seek_to_sample_coarse(f, sample_number))
      return 0;

   assert(f->current_loc_valid);
   assert(f->current_loc <= sample_number);

   // linear search for the relevant packet
   max_frame_samples = (f->blocksize_1*3 - f->blocksize_0) >> 2;
   while (f->current_loc < sample_number) {
      int left_start, left_end, right_start, right_end, mode, frame_samples;
      if (!peek_decode_initial(f, &left_start, &left_end, &right_start, &right_end, &mode))
         return error(f, VORBIS_seek_failed);
      // calculate the number of samples returned by the next frame
      frame_samples = right_start - left_start;
      if (f->current_loc + frame_samples > sample_number) {
         return 1; // the next frame will contain the sample
      } else if (f->current_loc + frame_samples + max_frame_samples > sample_number) {
         // there's a chance the frame after this could contain the sample
         vorbis_pump_first_frame(f);
      } else {
         // this frame is too early to be relevant
         f->current_loc += frame_samples;
         f->previous_length = 0;
         maybe_start_packet(f);
         flush_packet(f);
      }
   }
   // the next frame should start with the sample
   if (f->current_loc != sample_number) return error(f, VORBIS_seek_failed);
   return 1;
}